

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscStatements.cpp
# Opt level: O2

Statement *
slang::ast::WaitOrderStatement::fromSyntax
          (Compilation *compilation,WaitOrderStatementSyntax *syntax,ASTContext *context,
          StatementContext *stmtCtx)

{
  size_t sVar1;
  bool bVar2;
  int iVar3;
  SyntaxNode *this;
  SourceLocation SVar4;
  undefined4 extraout_var_00;
  ActionBlockSyntax *pAVar5;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  SourceLocation stmt;
  SourceLocation SVar6;
  ASTContext *extraout_RDX;
  ASTContext *extraout_RDX_00;
  ASTContext *extraout_RDX_01;
  ASTContext *src;
  ulong extraout_RDX_02;
  SourceRange sourceRange;
  const_iterator __begin2;
  Statement *ifFalse;
  Statement *ifTrue;
  SmallVector<const_slang::ast::Expression_*,_5UL> events;
  span<const_slang::ast::Expression_*,_18446744073709551615UL> local_a8;
  StatementContext *local_98;
  Statement *local_90;
  Statement *local_88;
  SourceRange local_80;
  SmallVectorBase<const_slang::ast::Expression_*> local_70 [2];
  undefined4 extraout_var;
  
  local_70[0].data_ = (pointer)local_70[0].firstElement;
  local_70[0].len = 0;
  local_a8._M_extent._M_extent_value = 0;
  local_70[0].cap = 5;
  sVar1 = (syntax->names).elements._M_extent._M_extent_value;
  src = context;
  local_a8._M_ptr = (pointer)&syntax->names;
  local_98 = stmtCtx;
  while( true ) {
    if (((SeparatedSyntaxList<slang::syntax::NameSyntax> *)local_a8._M_ptr == &syntax->names) &&
       (local_a8._M_extent._M_extent_value == sVar1 + 1 >> 1)) {
      local_88 = (Statement *)0x0;
      local_90 = (Statement *)0x0;
      pAVar5 = (syntax->action).ptr;
      if (pAVar5->statement != (StatementSyntax *)0x0) {
        iVar3 = Statement::bind((int)pAVar5->statement,(sockaddr *)context,(socklen_t)local_98);
        local_88 = (Statement *)CONCAT44(extraout_var_00,iVar3);
        pAVar5 = (syntax->action).ptr;
        src = extraout_RDX_00;
      }
      if (pAVar5->elseClause != (ElseClauseSyntax *)0x0) {
        iVar3 = Statement::bind((int)(pAVar5->elseClause->clause).ptr,(sockaddr *)context,
                                (socklen_t)local_98);
        local_90 = (Statement *)CONCAT44(extraout_var_01,iVar3);
        src = extraout_RDX_01;
      }
      iVar3 = SmallVectorBase<const_slang::ast::Expression_*>::copy
                        (local_70,(EVP_PKEY_CTX *)compilation,(EVP_PKEY_CTX *)src);
      local_a8._M_ptr = (pointer)CONCAT44(extraout_var_02,iVar3);
      local_a8._M_extent._M_extent_value = extraout_RDX_02;
      local_80 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
      stmt = (SourceLocation)
             BumpAllocator::
             emplace<slang::ast::WaitOrderStatement,std::span<slang::ast::Expression_const*,18446744073709551615ul>,slang::ast::Statement_const*&,slang::ast::Statement_const*&,slang::SourceRange>
                       (&compilation->super_BumpAllocator,&local_a8,&local_88,&local_90,&local_80);
      SVar4 = ((SourceRange *)((long)stmt + 0x10))->startLoc;
      bVar2 = ASTContext::requireTimingAllowed(context,*(SourceRange *)((long)stmt + 0x10));
      SVar6 = stmt;
      if (!bVar2) {
        SVar6 = (SourceLocation)Statement::badStmt(compilation,(Statement *)stmt);
        SVar4 = stmt;
      }
      goto LAB_00355282;
    }
    this = (SyntaxNode *)
           slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::
           iterator_base<const_slang::syntax::NameSyntax_*>::dereference
                     ((iterator_base<const_slang::syntax::NameSyntax_*> *)&local_a8);
    SVar4._0_4_ = Expression::bind((int)this,(sockaddr *)context,0);
    SVar4._4_4_ = extraout_var;
    bVar2 = Expression::bad((Expression *)SVar4);
    if (bVar2) goto LAB_00355273;
    bVar2 = Type::isEvent(((not_null<const_slang::ast::Type_*> *)((long)SVar4 + 8))->ptr);
    if (!bVar2) break;
    local_80.startLoc = SVar4;
    SmallVectorBase<slang::ast::Expression_const*>::emplace_back<slang::ast::Expression_const*>
              ((SmallVectorBase<slang::ast::Expression_const*> *)local_70,(Expression **)&local_80);
    local_a8._M_extent._M_extent_value = local_a8._M_extent._M_extent_value + 1;
    src = extraout_RDX;
  }
  sourceRange = slang::syntax::SyntaxNode::sourceRange(this);
  ASTContext::addDiag(context,(DiagCode)0x310008,sourceRange);
LAB_00355273:
  SVar4 = (SourceLocation)0x0;
  SVar6 = (SourceLocation)Statement::badStmt(compilation,(Statement *)0x0);
LAB_00355282:
  SmallVectorBase<const_slang::ast::Expression_*>::cleanup(local_70,(EVP_PKEY_CTX *)SVar4);
  return &((WaitOrderStatement *)SVar6)->super_Statement;
}

Assistant:

Statement& WaitOrderStatement::fromSyntax(Compilation& compilation,
                                          const WaitOrderStatementSyntax& syntax,
                                          const ASTContext& context, StatementContext& stmtCtx) {
    SmallVector<const Expression*> events;
    for (auto name : syntax.names) {
        auto& ev = Expression::bind(*name, context);
        if (ev.bad())
            return badStmt(compilation, nullptr);

        if (!ev.type->isEvent()) {
            context.addDiag(diag::NotAnEvent, name->sourceRange());
            return badStmt(compilation, nullptr);
        }

        events.push_back(&ev);
    }

    const Statement* ifTrue = nullptr;
    const Statement* ifFalse = nullptr;
    if (syntax.action->statement)
        ifTrue = &Statement::bind(*syntax.action->statement, context, stmtCtx);

    if (syntax.action->elseClause) {
        ifFalse = &Statement::bind(syntax.action->elseClause->clause->as<StatementSyntax>(),
                                   context, stmtCtx);
    }

    auto result = compilation.emplace<WaitOrderStatement>(events.copy(compilation), ifTrue, ifFalse,
                                                          syntax.sourceRange());

    if (!context.requireTimingAllowed(result->sourceRange))
        return badStmt(compilation, result);

    return *result;
}